

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# am_map.cpp
# Opt level: O3

void AM_NewResolution(void)

{
  double dVar1;
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  
  if ((min_scale_mtof == 0.0) && (!NAN(min_scale_mtof))) {
    return;
  }
  f_w = (screen->super_DSimpleCanvas).super_DCanvas.Width;
  auVar3._0_8_ = (double)f_w;
  auVar3._8_8_ = (double)ST_Y;
  auVar4._8_8_ = max_h;
  auVar4._0_8_ = max_w;
  auVar3 = divpd(auVar3,auVar4);
  dVar1 = auVar3._0_8_;
  if (auVar3._8_8_ <= auVar3._0_8_) {
    dVar1 = auVar3._8_8_;
  }
  max_scale_mtof = (double)(screen->super_DSimpleCanvas).super_DCanvas.Height * 0.03125;
  scale_mtof = (scale_mtof * dVar1) / min_scale_mtof;
  dVar2 = dVar1;
  if ((scale_mtof < dVar1) || (dVar2 = max_scale_mtof, max_scale_mtof < scale_mtof)) {
    scale_mtof = dVar2;
  }
  scale_ftom = 1.0 / scale_mtof;
  f_h = ST_Y;
  min_scale_mtof = dVar1;
  AM_activateNewScale();
  return;
}

Assistant:

void AM_NewResolution()
{
	double oldmin = min_scale_mtof;
	
	if ( oldmin == 0 ) 
	{
		return; // [SP] Not in a game, exit!
	}	
	AM_calcMinMaxMtoF();
	scale_mtof = scale_mtof * min_scale_mtof / oldmin;
	scale_ftom = 1 / scale_mtof;
	if (scale_mtof < min_scale_mtof)
		AM_minOutWindowScale();
	else if (scale_mtof > max_scale_mtof)
		AM_maxOutWindowScale();
	f_w = screen->GetWidth();
	f_h = ST_Y;
	AM_activateNewScale();
}